

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

int __thiscall
CVmObjHTTPRequest::getp_getCookies
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  long lVar2;
  CVmObjPageEntry *pCVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  void *pvVar9;
  char *pcVar10;
  char cVar11;
  char *len;
  undefined8 *puVar12;
  size_t bytelen;
  char *pcVar13;
  char *str;
  vm_val_t local_40;
  
  if (getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getCookies();
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getCookies::desc);
  if (iVar7 == 0) {
    lVar2 = *(long *)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    vVar8 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    pvVar6 = sp_;
    uVar5 = *(undefined4 *)&retval->field_0x4;
    aVar4 = retval->val;
    sp_ = sp_ + 1;
    pvVar6->typ = retval->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar4;
    puVar12 = *(undefined8 **)(lVar2 + 0x10);
    if (puVar12 != (undefined8 *)0x0) {
      uVar1 = (retval->val).obj;
      pCVar3 = G_obj_table_X.pages_[uVar1 >> 0xc];
      do {
        iVar7 = stricmp((char *)*puVar12,"cookie");
        if ((iVar7 == 0) && (pcVar10 = (char *)puVar12[1], *(char *)puVar12[1] != '\0')) {
          do {
            do {
              pcVar13 = pcVar10;
              cVar11 = *pcVar13;
              iVar7 = isspace((int)cVar11);
              pcVar10 = pcVar13 + 1;
            } while (iVar7 != 0);
            pcVar10 = pcVar13;
            if (cVar11 != '\0') {
              bytelen = 0;
              str = pcVar13 + 1;
LAB_00202064:
              pvVar9 = memchr("=;,",(int)cVar11,4);
              pcVar10 = str;
              if (pvVar9 == (void *)0x0) goto code_r0x0020207e;
              if (cVar11 == '=') {
                cVar11 = *str;
                while ((cVar11 != '\0' &&
                       (pvVar9 = memchr(" \t;,",(int)cVar11,5), pvVar9 == (void *)0x0))) {
                  cVar11 = pcVar10[1];
                  pcVar10 = pcVar10 + 1;
                }
                len = pcVar10 + (~(ulong)pcVar13 - bytelen);
                goto LAB_002020a2;
              }
              pcVar10 = str + -1;
              goto LAB_00202098;
            }
LAB_00202092:
            bytelen = (long)pcVar10 - (long)pcVar13;
LAB_00202098:
            str = "";
            len = (char *)0x0;
LAB_002020a2:
            local_40.val.obj = CVmObjString::create(0,pcVar13,bytelen);
            local_40.typ = VM_OBJ;
            lVar2 = *(long *)((long)&G_obj_table_X.pages_[local_40.val.obj >> 0xc]
                                     [local_40.val.obj & 0xfff].ptr_ + 8);
            pcVar13 = (char *)(lVar2 + 2);
            CCharmapToUni::validate(pcVar13,((lVar2 + bytelen) - (long)pcVar13) + 2);
            add_parsed_val((CVmObjLookupTable *)
                           ((long)&pCVar3->ptr_ + (ulong)((uVar1 & 0xfff) * 0x18)),&local_40,str,
                           (size_t)len,0);
            cVar11 = *pcVar10;
            while( true ) {
              if (cVar11 == '\0') goto LAB_00202024;
              pvVar9 = memchr(" \t;,",(int)cVar11,5);
              if (pvVar9 == (void *)0x0) break;
              cVar11 = pcVar10[1];
              pcVar10 = pcVar10 + 1;
            }
          } while( true );
        }
LAB_00202024:
        puVar12 = (undefined8 *)puVar12[2];
      } while (puVar12 != (undefined8 *)0x0);
    }
    sp_ = sp_ + -1;
  }
  return 1;
code_r0x0020207e:
  cVar11 = *str;
  bytelen = bytelen + 1;
  str = str + 1;
  if (cVar11 == '\0') goto LAB_00202092;
  goto LAB_00202064;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookies(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* add this cookie to the table */
                add_parsed_val(vmg_ tab, name, namelen, val, vallen,
                               ENCMODE_NONE);

                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}